

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<long,4ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_4UL>_>_>_>
          *result)

{
  vector<nonstd::optional_lite::optional<std::array<long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_4UL>_>_>_>
  *pvVar1;
  bool bVar2;
  allocator local_169;
  string local_168;
  optional<std::array<long,_4UL>_> local_148;
  undefined1 local_120 [8];
  array<long,_4UL> value_1;
  optional<std::array<long,_4UL>_> local_f8;
  char local_c9;
  undefined1 local_c8 [7];
  char c;
  allocator local_99;
  string local_98;
  undefined1 local_78 [8];
  array<long,_4UL> value;
  optional<std::array<long,_4UL>_> local_50;
  vector<nonstd::optional_lite::optional<std::array<long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_4UL>_>_>_>
  *local_28;
  vector<nonstd::optional_lite::optional<std::array<long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_4UL>_>_>_>
  *result_local;
  AsciiParser *pAStack_18;
  char sep_local;
  AsciiParser *this_local;
  
  local_28 = result;
  result_local._7_1_ = sep;
  pAStack_18 = this;
  ::std::
  vector<nonstd::optional_lite::optional<std::array<long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_4UL>_>_>_>
  ::clear(result);
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    bVar2 = MaybeNone(this);
    pvVar1 = local_28;
    if (bVar2) {
      nonstd::optional_lite::optional<std::array<long,_4UL>_>::optional(&local_50);
      ::std::
      vector<nonstd::optional_lite::optional<std::array<long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_4UL>_>_>_>
      ::push_back(pvVar1,&local_50);
      nonstd::optional_lite::optional<std::array<long,_4UL>_>::~optional(&local_50);
    }
    else {
      bVar2 = ParseBasicTypeTuple<long,4ul>(this,(array<long,_4UL> *)local_78);
      pvVar1 = local_28;
      if (!bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_98,"Not starting with the tuple value of requested type.\n",
                   &local_99);
        PushError(this,&local_98);
        ::std::__cxx11::string::~string((string *)&local_98);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
        return false;
      }
      nonstd::optional_lite::optional<std::array<long,_4UL>_>::optional<std::array<long,_4UL>_&,_0>
                ((optional<std::array<long,_4UL>_> *)local_c8,(array<long,_4UL> *)local_78);
      ::std::
      vector<nonstd::optional_lite::optional<std::array<long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_4UL>_>_>_>
      ::push_back(pvVar1,(value_type *)local_c8);
      nonstd::optional_lite::optional<std::array<long,_4UL>_>::~optional
                ((optional<std::array<long,_4UL>_> *)local_c8);
    }
    while (bVar2 = Eof(this), ((bVar2 ^ 0xffU) & 1) != 0) {
      bVar2 = SkipWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
      bVar2 = Char1(this,&local_c9);
      if (!bVar2) {
        return false;
      }
      if (local_c9 != result_local._7_1_) {
        StreamReader::seek_from_current(this->_sr,-1);
        break;
      }
      bVar2 = SkipWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
      bVar2 = MaybeNone(this);
      pvVar1 = local_28;
      if (bVar2) {
        nonstd::optional_lite::optional<std::array<long,_4UL>_>::optional(&local_f8);
        ::std::
        vector<nonstd::optional_lite::optional<std::array<long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_4UL>_>_>_>
        ::push_back(pvVar1,&local_f8);
        nonstd::optional_lite::optional<std::array<long,_4UL>_>::~optional(&local_f8);
      }
      else {
        bVar2 = ParseBasicTypeTuple<long,4ul>(this,(array<long,_4UL> *)local_120);
        pvVar1 = local_28;
        if (!bVar2) break;
        nonstd::optional_lite::optional<std::array<long,_4UL>_>::
        optional<std::array<long,_4UL>_&,_0>(&local_148,(array<long,_4UL> *)local_120);
        ::std::
        vector<nonstd::optional_lite::optional<std::array<long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_4UL>_>_>_>
        ::push_back(pvVar1,&local_148);
        nonstd::optional_lite::optional<std::array<long,_4UL>_>::~optional(&local_148);
      }
    }
    bVar2 = ::std::
            vector<nonstd::optional_lite::optional<std::array<long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_4UL>_>_>_>
            ::empty(local_28);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_168,"Empty array.\n",&local_169);
      PushError(this,&local_168);
      ::std::__cxx11::string::~string((string *)&local_168);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_169);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}